

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O0

void __thiscall HashMap<TypeClass_*>::~HashMap(HashMap<TypeClass_*> *this)

{
  HashMap<TypeClass_*> *this_local;
  
  if (this->entries != (Node **)0x0) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<HashMap<TypeClass*>::Node*>(this->entries,0x400);
    }
    else {
      Allocator::destruct<HashMap<TypeClass*>::Node*>(this->allocator,this->entries,0x400);
    }
  }
  this->entries = (Node **)0x0;
  SmallArray<HashMap<TypeClass_*>::Node_*,_32U>::~SmallArray(&this->freeList);
  ChunkedStackPool<4092>::~ChunkedStackPool(&this->nodePool);
  return;
}

Assistant:

~HashMap()
	{
		if(entries)
		{
			if(allocator)
				allocator->destruct(entries, bucketCount);
			else
				NULLC::destruct(entries, bucketCount);
		}

		entries = NULL;
	}